

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Token> *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  token v;
  optional<tinyusdz::Token> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Token>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    Token::Token((Token *)local_48);
    this_local._7_1_ = ReadBasicType(this,(token *)local_48);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::Token>::operator=(value,(Token *)local_48);
    }
    Token::~Token((Token *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::token> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::token v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}